

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStructMatrix.cpp
# Opt level: O0

void __thiscall
TPZStructMatrix::TPZStructMatrix(TPZStructMatrix *this,void **vtt,TPZAutoPointer<TPZCompMesh> *mesh)

{
  TPZAutoPointer<TPZCompMesh> *in_RDX;
  undefined8 *in_RSI;
  TPZCompMesh *in_RDI;
  TPZAutoPointer<TPZCompMesh> *in_stack_ffffffffffffff98;
  ESolType *mesh_00;
  TPZStructMatrix *this_00;
  TPZEquationFilter *this_01;
  
  *(undefined8 *)in_RDI = *in_RSI;
  *(undefined8 *)
   ((long)(in_RDI->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fVec.fExtAlloc +
   *(long *)(*(long *)in_RDI + -0x60) + -0x70) = in_RSI[1];
  *(undefined8 *)
   ((long)(in_RDI->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fVec.fExtAlloc +
   *(long *)(*(long *)in_RDI + -0x68) + -0x70) = in_RSI[2];
  in_RDI->fReference = (TPZGeoMesh *)0x0;
  mesh_00 = &in_RDI->fSolType;
  this_01 = (TPZEquationFilter *)0x0;
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer((TPZAutoPointer<TPZCompMesh> *)0x0,in_RDI);
  this_00 = (TPZStructMatrix *)&in_RDI->fGMesh;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1d703ed);
  TPZEquationFilter::TPZEquationFilter(this_01,(int64_t)in_RDI);
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(in_RDX,in_stack_ffffffffffffff98);
  SetMesh(this_00,(TPZAutoPointer<TPZCompMesh> *)mesh_00);
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(in_RDX);
  return;
}

Assistant:

TPZStructMatrix::TPZStructMatrix(TPZAutoPointer<TPZCompMesh> mesh)
    : TPZStrMatParInterface(), fEquationFilter(0) {
    SetMesh(mesh);
}